

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O1

REF_STATUS ref_cell_id_range(REF_CELL ref_cell,REF_MPI ref_mpi,REF_INT *min_id,REF_INT *max_id)

{
  bool bVar1;
  REF_STATUS RVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  REF_INT cell;
  REF_INT global;
  REF_INT nodes [27];
  REF_INT local_ac;
  REF_INT local_a8 [30];
  
  *min_id = 0x7fffffff;
  *max_id = -0x80000000;
  if (ref_cell->last_node_is_an_id == 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x43c,
           "ref_cell_id_range","cell does not have ids");
    return 1;
  }
  if (0 < ref_cell->max) {
    cell = 0;
    do {
      RVar2 = ref_cell_nodes(ref_cell,cell,local_a8);
      if (RVar2 == 0) {
        iVar5 = local_a8[ref_cell->node_per];
        if (*min_id < local_a8[ref_cell->node_per]) {
          iVar5 = *min_id;
        }
        *min_id = iVar5;
        iVar5 = local_a8[ref_cell->node_per];
        if (local_a8[ref_cell->node_per] < *max_id) {
          iVar5 = *max_id;
        }
        *max_id = iVar5;
      }
      cell = cell + 1;
    } while (cell < ref_cell->max);
  }
  if (ref_mpi == (REF_MPI)0x0) {
    return 0;
  }
  if (ref_mpi->n < 2) {
    return 0;
  }
  uVar3 = ref_mpi_min(ref_mpi,min_id,&local_ac,1);
  if (uVar3 == 0) {
    uVar4 = ref_mpi_bcast(ref_mpi,&local_ac,1,1);
    if (uVar4 == 0) {
      *min_id = local_ac;
      uVar4 = ref_mpi_max(ref_mpi,max_id,&local_ac,1);
      if (uVar4 == 0) {
        uVar4 = ref_mpi_bcast(ref_mpi,&local_ac,1,1);
        if (uVar4 == 0) {
          *max_id = local_ac;
          bVar1 = true;
          goto LAB_00111731;
        }
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",1099
               ,"ref_cell_id_range",(ulong)uVar4,"mpi max face");
        uVar3 = uVar4;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
               0x44a,"ref_cell_id_range",(ulong)uVar4,"mpi max face");
        uVar3 = uVar4;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x447,
             "ref_cell_id_range",(ulong)uVar4,"mpi min face");
      uVar3 = uVar4;
    }
    bVar1 = false;
  }
  else {
    bVar1 = false;
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x446,
           "ref_cell_id_range",(ulong)uVar3,"mpi min face");
  }
LAB_00111731:
  if (bVar1) {
    return 0;
  }
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_cell_id_range(REF_CELL ref_cell, REF_MPI ref_mpi,
                                     REF_INT *min_id, REF_INT *max_id) {
  REF_INT cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];

  *min_id = REF_INT_MAX;
  *max_id = REF_INT_MIN;

  RAS(ref_cell_last_node_is_an_id(ref_cell), "cell does not have ids");

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    *min_id = MIN(*min_id, nodes[ref_cell_id_index(ref_cell)]);
    *max_id = MAX(*max_id, nodes[ref_cell_id_index(ref_cell)]);
  }